

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeStorage(ImGuiStorage *storage,char *label)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ImGuiStoragePair *pIVar4;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RSI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *p;
  int n;
  ImVector<ImGuiStorage::ImGuiStoragePair> *this;
  int local_14;
  
  uVar1 = in_RDI->Size;
  this = in_RSI;
  uVar3 = ImVector<ImGuiStorage::ImGuiStoragePair>::size_in_bytes(in_RDI);
  bVar2 = TreeNode((char *)in_RSI,"%s: %d entries, %d bytes",this,(ulong)uVar1,(ulong)uVar3);
  if (bVar2) {
    for (local_14 = 0; local_14 < in_RDI->Size; local_14 = local_14 + 1) {
      pIVar4 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                         (this,(int)((ulong)in_RSI >> 0x20));
      BulletText("Key 0x%08X Value { i: %d }",(ulong)pIVar4->key,
                 (ulong)(uint)(pIVar4->field_1).val_i);
    }
    TreePop();
  }
  return;
}

Assistant:

static void NodeStorage(ImGuiStorage* storage, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
                return;
            for (int n = 0; n < storage->Data.Size; n++)
            {
                const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
                ImGui::BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
            }
            ImGui::TreePop();
        }